

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O0

Promise<void> __thiscall
capnp::_::TestStreamingImpl::doStreamJ(TestStreamingImpl *this,DoStreamJContext context)

{
  SourceLocation location;
  uint32_t uVar1;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *t;
  Promise<void> *pPVar2;
  undefined8 in_stack_ffffffffffffff30;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *this_00;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> local_b0;
  SourceLocation local_98;
  undefined1 local_80 [8];
  PromiseFulfillerPair<void> paf;
  Fault local_58;
  Fault f;
  TestStreamingImpl *this_local;
  DoStreamJContext context_local;
  
  context_local.hook = (CallContextHook *)this;
  StreamingCallContext<capnproto_test::capnp::test::TestStreaming::DoStreamJParams>::getParams
            ((Reader *)&f,
             (StreamingCallContext<capnproto_test::capnp::test::TestStreaming::DoStreamJParams> *)
             &this_local);
  uVar1 = capnproto_test::capnp::test::TestStreaming::DoStreamJParams::Reader::getJ((Reader *)&f);
  *(uint32_t *)((long)&context.hook[1]._vptr_CallContextHook + 4) =
       uVar1 + *(int *)((long)&context.hook[1]._vptr_CallContextHook + 4);
  if (((ulong)context.hook[4]._vptr_CallContextHook & 1) == 0) {
    kj::SourceLocation::SourceLocation
              (&local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.h"
               ,"doStreamJ",0x165,0x10);
    location.function = (char *)local_98._16_8_;
    location.fileName = local_98.function;
    location.lineNumber = (int)in_stack_ffffffffffffff30;
    location.columnNumber = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
    kj::newPromiseAndFulfiller<void>(location);
    t = kj::mv<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>
                  ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&paf);
    this_00 = &local_b0;
    kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::Maybe(this_00,t);
    kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::operator=
              ((Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)(context.hook + 2),
               this_00);
    kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::~Maybe(&local_b0);
    pPVar2 = kj::mv<kj::Promise<void>>((Promise<void> *)local_80);
    kj::Promise<void>::Promise((Promise<void> *)this,pPVar2);
    kj::PromiseFulfillerPair<void>::~PromiseFulfillerPair((PromiseFulfillerPair<void> *)local_80);
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.h"
               ,0x161,FAILED,(char *)0x0,"\"throw requested\"",(char (*) [16])"throw requested");
    kj::_::Debug::Fault::~Fault(&local_58);
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> doStreamJ(DoStreamJContext context) override {
    jSum += context.getParams().getJ();

    if (jShouldThrow) {
      KJ_FAIL_ASSERT("throw requested") { break; }
      return kj::READY_NOW;
    }

    auto paf = kj::newPromiseAndFulfiller<void>();
    fulfiller = kj::mv(paf.fulfiller);
    return kj::mv(paf.promise);
  }